

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O0

ssize_t __thiscall Peer::read_abi_cxx11_(Peer *this,int __fd,void *__buf,size_t __nbytes)

{
  Socket __fd_00;
  size_type __n;
  reference __buf_00;
  ssize_t sVar1;
  PeerException *this_00;
  int *piVar2;
  char *pcVar3;
  Events *this_01;
  unique_ptr<Event,_std::default_delete<Event>_> *this_02;
  pointer this_03;
  Peers *this_04;
  undefined4 in_register_00000034;
  Peer *args;
  allocator<char> local_f9;
  undefined4 local_f8;
  undefined1 local_f2;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_50;
  int recv;
  allocator_type local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> buf;
  int length_local;
  Peer *this_local;
  
  args = (Peer *)CONCAT44(in_register_00000034,__fd);
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = SUB84(__buf,0);
  __n = (size_type)(int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,__n,&local_39);
  std::allocator<char>::~allocator(&local_39);
  __fd_00 = SocketResource::resource(&args->m_socket);
  __buf_00 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_38,0);
  sVar1 = ::recv(__fd_00,__buf_00,
                 (long)(int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,0x40)
  ;
  local_50 = (int)sVar1;
  if (local_50 == -1) {
    local_f2 = 1;
    this_00 = (PeerException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"Failed to read peer ",&local_f1);
    std::operator+(&local_d0,&local_f0,&args->m_name);
    std::operator+(&local_b0,&local_d0," ");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    std::operator+(&local_90,&local_b0,pcVar3);
    std::operator+(&local_70,&local_90,"\n");
    PeerException::PeerException(this_00,&local_70);
    local_f2 = 0;
    __cxa_throw(this_00,&PeerException::typeinfo,PeerException::~PeerException);
  }
  if (local_50 == 0) {
    args->m_connected = false;
    this_01 = P2PSocket::events(args->m_master);
    this_02 = Events::onPeerDisconnect(this_01);
    this_03 = std::unique_ptr<Event,_std::default_delete<Event>_>::operator->(this_02);
    Event::trigger<Peer*>(this_03,args);
    this_04 = P2PSocket::peers(args->m_master);
    Peers::remove(this_04,(char *)args);
    std::__cxx11::string::string((string *)this);
  }
  else {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_38,(long)local_50);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)this,pcVar3,&local_f9);
    std::allocator<char>::~allocator(&local_f9);
  }
  local_f8 = 1;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return (ssize_t)this;
}

Assistant:

std::string Peer::read(const int length)
{
    std::vector<char> buf(length);
    int recv = ::recv(m_socket.resource(), &buf[0], length, MSG_DONTWAIT);
    if (recv == -1) {
        throw PeerException(std::string{"Failed to read peer "} + m_name + " " +
                            std::strerror(errno) + "\n");
    }
    if (recv == 0) {
        // Connection is no longer valid, remote has been disconnected
        m_connected = false;
        this->m_master->events()->onPeerDisconnect()->trigger(this);
        this->m_master->peers()->remove(this);
        return std::string{};
    }
    buf.resize(recv);
    return std::string{buf.data()};
}